

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktComputeBasicComputeShaderTests.cpp
# Opt level: O2

TestStatus *
vkt::compute::anon_unknown_0::EmptyShaderTest::createTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  ProgramCollection<vk::ProgramBinary> *this;
  Handle<(vk::HandleType)24> HVar1;
  deUint32 queueFamilyIndex;
  DeviceInterface *deviceInterface;
  VkDevice device;
  VkQueue queue;
  ProgramBinary *binary;
  allocator<char> local_f9;
  string local_f8;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_d8;
  RefBase<vk::Handle<(vk::HandleType)18>_> local_b8;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_98;
  string local_78;
  RefBase<vk::Handle<(vk::HandleType)14>_> local_58;
  
  deviceInterface = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queue = Context::getUniversalQueue(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  this = context->m_progCollection;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"comp",(allocator<char> *)&local_b8);
  binary = ::vk::ProgramCollection<vk::ProgramBinary>::get(this,&local_f8);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&local_98,deviceInterface,device,binary,0);
  local_58.m_data.deleter.m_device = local_98.m_data.deleter.m_device;
  local_58.m_data.deleter.m_allocator = local_98.m_data.deleter.m_allocator;
  local_58.m_data.object.m_internal = local_98.m_data.object.m_internal;
  local_58.m_data.deleter.m_deviceIface = local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_98);
  std::__cxx11::string::~string((string *)&local_f8);
  makePipelineLayout((Move<vk::Handle<(vk::HandleType)16>_> *)&local_f8,deviceInterface,device);
  local_98.m_data.deleter.m_device = (VkDevice)local_f8.field_2._M_allocated_capacity;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_f8.field_2._8_8_;
  local_98.m_data.object.m_internal = (deUint64)local_f8._M_dataplus._M_p;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)local_f8._M_string_length;
  local_f8._M_dataplus._M_p = (pointer)0x0;
  local_f8._M_string_length = 0;
  local_f8.field_2._M_allocated_capacity = 0;
  local_f8.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_f8);
  makeComputePipeline((Move<vk::Handle<(vk::HandleType)18>_> *)&local_b8,deviceInterface,device,
                      (VkPipelineLayout)local_98.m_data.object.m_internal,
                      (VkShaderModule)local_58.m_data.object.m_internal);
  local_f8.field_2._M_allocated_capacity = (size_type)local_b8.m_data.deleter.m_device;
  local_f8.field_2._8_8_ = local_b8.m_data.deleter.m_allocator;
  local_f8._M_dataplus._M_p = (pointer)local_b8.m_data.object.m_internal;
  local_f8._M_string_length = (size_type)local_b8.m_data.deleter.m_deviceIface;
  local_b8.m_data.object.m_internal = 0;
  local_b8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_b8.m_data.deleter.m_device = (VkDevice)0x0;
  local_b8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase(&local_b8);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)&local_d8,deviceInterface,device,
                  queueFamilyIndex);
  local_b8.m_data.deleter.m_device = local_d8.m_data.deleter.m_device;
  local_b8.m_data.deleter.m_allocator = local_d8.m_data.deleter.m_allocator;
  local_b8.m_data.object.m_internal = local_d8.m_data.object.m_internal;
  local_b8.m_data.deleter.m_deviceIface = local_d8.m_data.deleter.m_deviceIface;
  local_d8.m_data.object.m_internal = 0;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_d8.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_d8);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_78,deviceInterface,device,
             (VkCommandPool)local_b8.m_data.object.m_internal,VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  local_d8.m_data.deleter.m_device = (VkDevice)local_78.field_2._M_allocated_capacity;
  local_d8.m_data.deleter.m_allocator = (VkAllocationCallbacks *)local_78.field_2._8_8_;
  local_d8.m_data.object.m_internal = (deUint64)local_78._M_dataplus._M_p;
  local_d8.m_data.deleter.m_deviceIface = (DeviceInterface *)local_78._M_string_length;
  local_78._M_dataplus._M_p = (pointer)0x0;
  local_78._M_string_length = 0;
  local_78.field_2._M_allocated_capacity = 0;
  local_78.field_2._8_8_ = 0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_78);
  HVar1.m_internal = local_d8.m_data.object.m_internal;
  beginCommandBuffer(deviceInterface,(VkCommandBuffer)local_d8.m_data.object.m_internal);
  (*deviceInterface->_vptr_DeviceInterface[0x4c])
            (deviceInterface,HVar1.m_internal,1,local_f8._M_dataplus._M_p);
  (*deviceInterface->_vptr_DeviceInterface[0x5d])
            (deviceInterface,local_d8.m_data.object.m_internal,1,1,1);
  endCommandBuffer(deviceInterface,(VkCommandBuffer)local_d8.m_data.object.m_internal);
  submitCommandsAndWait
            (deviceInterface,device,queue,(VkCommandBuffer)local_d8.m_data.object.m_internal);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"Compute succeeded",&local_f9);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_d8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)24>_> *)&local_b8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)18>_> *)&local_f8);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)16>_> *)&local_98);
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)14>_>::~RefBase(&local_58);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createTest (Context& context)
{
	const DeviceInterface&	vk					= context.getDeviceInterface();
	const VkDevice			device				= context.getDevice();
	const VkQueue			queue				= context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	const Unique<VkShaderModule> shaderModule(createShaderModule(vk, device, context.getBinaryCollection().get("comp"), 0u));

	const Unique<VkPipelineLayout> pipelineLayout(makePipelineLayout(vk, device));
	const Unique<VkPipeline> pipeline(makeComputePipeline(vk, device, *pipelineLayout, *shaderModule));

	const Unique<VkCommandPool> cmdPool(makeCommandPool(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer> cmdBuffer(allocateCommandBuffer(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	// Start recording commands

	beginCommandBuffer(vk, *cmdBuffer);

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_COMPUTE, *pipeline);

	const tcu::IVec3 workGroups(1, 1, 1);
	vk.cmdDispatch(*cmdBuffer, workGroups.x(), workGroups.y(), workGroups.z());

	endCommandBuffer(vk, *cmdBuffer);

	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	return tcu::TestStatus::pass("Compute succeeded");
}